

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O0

int Abc_FrameSetLutLibrary(Abc_Frame_t *pAbc,char *pLutLibString)

{
  If_LibLut_t *pLib_00;
  If_LibLut_t *pLutLib;
  If_LibLut_t *pLib;
  char *pLutLibString_local;
  Abc_Frame_t *pAbc_local;
  
  pLib_00 = If_LibLutReadString(pLutLibString);
  if (pLib_00 != (If_LibLut_t *)0x0) {
    pLutLib = (If_LibLut_t *)Abc_FrameReadLibLut();
    If_LibLutFree(pLutLib);
    Abc_FrameSetLibLut(pLib_00);
  }
  else {
    fprintf(_stdout,"Reading LUT library from string has failed.\n");
  }
  pAbc_local._4_4_ = (uint)(pLib_00 != (If_LibLut_t *)0x0);
  return pAbc_local._4_4_;
}

Assistant:

int Abc_FrameSetLutLibrary( Abc_Frame_t * pAbc, char * pLutLibString )
{
    If_LibLut_t * pLib = If_LibLutReadString( pLutLibString );
    if ( pLib == NULL )
    {
        fprintf( stdout, "Reading LUT library from string has failed.\n" );
        return 0;
    }
    // replace the current library
    If_LibLutFree( (If_LibLut_t *)Abc_FrameReadLibLut() );
    Abc_FrameSetLibLut( pLib );
    return 1;
}